

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.hpp
# Opt level: O3

void __thiscall helics::BrokerKeeper::~BrokerKeeper(BrokerKeeper *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  
  bVar3 = BrokerApp::isConnected(&this->brk);
  if (bVar3) {
    BrokerApp::waitForDisconnect(&this->brk,(milliseconds)0x0);
  }
  pcVar2 = (this->brk).name._M_dataplus._M_p;
  paVar1 = &(this->brk).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->brk).broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~BrokerKeeper()
    {
        if (brk.isConnected()) {
            brk.waitForDisconnect();
        }
    }